

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

int __thiscall
xercesc_4_0::ICUTransService::compareIString(ICUTransService *this,XMLCh *comp1,XMLCh *comp2)

{
  long lVar1;
  size_t sVar2;
  int iVar3;
  int iVar4;
  UChar32 folded2;
  UChar32 folded1;
  UChar32 ch2;
  UChar32 ch1;
  size_t j;
  size_t i;
  XMLCh *comp2_local;
  XMLCh *comp1_local;
  ICUTransService *this_local;
  
  j = 0;
  _ch2 = 0;
  while( true ) {
    folded1 = (UChar32)(ushort)comp1[j];
    sVar2 = j + 1;
    if ((folded1 & 0xfffffc00U) == 0xd800) {
      folded1 = folded1 * 0x400 + (uint)(ushort)comp1[j + 1] + -0x35fdc00;
      sVar2 = j + 2;
    }
    j = sVar2;
    folded2 = (UChar32)(ushort)comp2[_ch2];
    lVar1 = _ch2 + 1;
    if ((folded2 & 0xfffffc00U) == 0xd800) {
      folded2 = folded2 * 0x400 + (uint)(ushort)comp2[_ch2 + 1] + -0x35fdc00;
      lVar1 = _ch2 + 2;
    }
    _ch2 = lVar1;
    iVar3 = u_foldCase_70(folded1,0);
    iVar4 = u_foldCase_70(folded2);
    if (iVar3 != iVar4) break;
    if (folded1 == 0) {
      return 0;
    }
  }
  return iVar3 - iVar4;
}

Assistant:

int ICUTransService::compareIString(const   XMLCh* const    comp1
                                    , const XMLCh* const    comp2)
{
    size_t  i = 0;
    size_t  j = 0;

    for(;;)
    {
        UChar32 ch1;
        UChar32 ch2;

        U16_NEXT_UNSAFE(comp1, i, ch1);
        U16_NEXT_UNSAFE(comp2, j, ch2);

        const UChar32   folded1 =
            u_foldCase(ch1, U_FOLD_CASE_DEFAULT);

        const UChar32   folded2 =
            u_foldCase(ch2, U_FOLD_CASE_DEFAULT);

        if (folded1 !=
            folded2)
        {
            return folded1 - folded2;
        }
        else if (ch1 == 0)
        {
            // If ch1 is 0, the ch2 must also be
            // 0.  Otherwise, the previous if
            // would have failed.
            break;
        }
    }

    return 0;
}